

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_partition.h
# Opt level: O3

size_t embree::
       parallel_partitioning<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>
                 (uint *array,size_t begin,size_t end,int *identity,unsigned_long *leftReduction,
                 unsigned_long *rightReduction,anon_class_8_1_a8a30a3a *is_left,
                 anon_class_1_0_00000001 *reduction_t,anon_class_1_0_00000001 *reduction_v,
                 size_t BLOCK_SIZE)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  _Var5;
  task *ptVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  uint *puVar10;
  runtime_error *prVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  size_t sVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  task_group_context context;
  long local_128;
  long local_120;
  anon_class_8_1_a8a30a3a local_118;
  task_traits local_110;
  __uniq_ptr_impl<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  local_108;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  local_100;
  int *local_f8;
  undefined1 local_f0 [56];
  undefined8 local_b8;
  task_group_context local_b0;
  
  if (begin < 0x80) {
    puVar10 = array + begin;
    puVar15 = array;
    do {
      puVar10 = puVar10 + -1;
      for (; (puVar15 <= puVar10 && ((ulong)*puVar15 < *(ulong *)*rightReduction));
          puVar15 = puVar15 + 1) {
        *(ulong *)identity = *(long *)identity + (ulong)*puVar15;
      }
      while( true ) {
        if (puVar10 < puVar15) {
          return (long)puVar15 - (long)array >> 2;
        }
        uVar7 = (ulong)*puVar10;
        if (uVar7 < *(ulong *)*rightReduction) break;
        *leftReduction = *leftReduction + uVar7;
        puVar10 = puVar10 + -1;
      }
      *(ulong *)identity = *(long *)identity + uVar7;
      *leftReduction = *leftReduction + (ulong)*puVar15;
      uVar3 = *puVar15;
      *puVar15 = *puVar10;
      *puVar10 = uVar3;
      puVar15 = puVar15 + 1;
    } while( true );
  }
  local_f8 = (int *)end;
  _Var5._M_head_impl =
       (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
        *)alignedMalloc(0x10c0,0x40);
  (_Var5._M_head_impl)->array = array;
  (_Var5._M_head_impl)->N = begin;
  (_Var5._M_head_impl)->is_left = (anon_class_8_1_a8a30a3a *)rightReduction;
  (_Var5._M_head_impl)->reduction_t = (anon_class_1_0_00000001 *)is_left;
  (_Var5._M_head_impl)->reduction_v = reduction_t;
  (_Var5._M_head_impl)->identity = local_f8;
  uVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var13 = (_func_int **)(begin + 0x7f >> 7);
  pp_Var12 = (_func_int **)0x40;
  if (uVar3 < 0x40) {
    pp_Var12 = (_func_int **)(ulong)uVar3;
  }
  if (pp_Var12 <= pp_Var13) {
    pp_Var13 = pp_Var12;
  }
  (_Var5._M_head_impl)->numTasks = (size_t)pp_Var13;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = 8;
  local_108._M_t.
  super__Tuple_impl<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  .
  super__Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  ._M_head_impl =
       (tuple<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
        )(tuple<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
          )_Var5._M_head_impl;
  local_100._M_head_impl = _Var5._M_head_impl;
  tbb::detail::r1::initialize((task_group_context *)(local_f0 + 0x40));
  local_110.m_version_and_traits = (uint64_t)&local_100;
  if (pp_Var13 != (_func_int **)0x0) {
    local_f0._0_8_ = (small_object_pool *)0x0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)local_f0,0xc0);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_001970d0;
    ptVar6[1]._vptr_task = pp_Var13;
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 1;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_110;
    ptVar6[1].m_reserved[2] = 0;
    ptVar6[1].m_reserved[3] = 1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar6[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
    ptVar6[1].m_reserved[5] = (long)iVar4 * 2 & 0x7ffffffffffffffe;
    ptVar6[2].super_task_traits.m_version_and_traits = local_f0._0_8_;
    local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
    local_f0._40_4_ = 1;
    local_f0._48_8_ = 1;
    local_b8 = 1;
    ptVar6[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
    tbb::detail::r1::execute_and_wait
              (ptVar6,(task_group_context *)(local_f0 + 0x40),(wait_context *)(local_f0 + 0x30),
               (task_group_context *)(local_f0 + 0x40));
  }
  cVar2 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)(local_f0 + 0x40));
  if (cVar2 != '\0') {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"task cancelled");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)(local_f0 + 0x40));
  (_Var5._M_head_impl)->counter_start[(_Var5._M_head_impl)->numTasks] = (_Var5._M_head_impl)->N;
  (_Var5._M_head_impl)->counter_left[(_Var5._M_head_impl)->numTasks] = 0;
  if ((_Var5._M_head_impl)->numTasks == 0) {
    sVar14 = (_Var5._M_head_impl)->counter_left[0];
  }
  else {
    uVar7 = 0;
    do {
      *(unsigned_long *)identity = *(long *)identity + (_Var5._M_head_impl)->leftReductions[uVar7];
      *leftReduction = *leftReduction + (_Var5._M_head_impl)->rightReductions[uVar7];
      uVar7 = uVar7 + 1;
      uVar1 = (_Var5._M_head_impl)->numTasks;
    } while (uVar7 < uVar1);
    sVar14 = (_Var5._M_head_impl)->counter_left[0];
    if (uVar1 < 2) {
      sVar9 = (_Var5._M_head_impl)->N;
      local_118.split = (uint64_t *)0x0;
      local_120 = 0;
      local_128 = 0;
      if (uVar1 == 0) goto LAB_0015c6c0;
    }
    else {
      lVar8 = 0;
      do {
        sVar14 = sVar14 + (_Var5._M_head_impl)->counter_left[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (uVar1 - 1 != lVar8);
      sVar9 = (_Var5._M_head_impl)->N;
    }
    local_118.split = (uint64_t *)0x0;
    local_120 = 0;
    local_128 = 0;
    lVar17 = 0;
    pp_Var13 = (_func_int **)0x0;
    lVar8 = 0;
    puVar18 = (uint64_t *)0x0;
    do {
      sVar20 = (_Var5._M_head_impl)->counter_start[(long)pp_Var13];
      sVar21 = (_Var5._M_head_impl)->counter_left[(long)pp_Var13] + sVar20;
      sVar23 = 0;
      if (0 < (long)sVar21) {
        sVar23 = sVar21;
      }
      sVar22 = (_Var5._M_head_impl)->counter_start[(long)pp_Var13 + 1];
      if ((long)sVar14 < (long)(_Var5._M_head_impl)->counter_start[(long)pp_Var13 + 1]) {
        sVar22 = sVar14;
      }
      if ((long)sVar20 < (long)sVar14) {
        sVar20 = sVar14;
      }
      if ((long)sVar9 < (long)sVar21) {
        sVar21 = sVar9;
      }
      puVar19 = puVar18;
      if (sVar22 - sVar23 != 0 && (long)sVar23 <= (long)sVar22) {
        lVar17 = lVar17 + (sVar22 - sVar23);
        puVar19 = (uint64_t *)((long)puVar18 + 1);
        (_Var5._M_head_impl)->leftMisplacedRanges[(long)puVar18]._begin = sVar23;
        (_Var5._M_head_impl)->leftMisplacedRanges[(long)puVar18]._end = sVar22;
        local_128 = lVar17;
        local_118.split = puVar19;
      }
      lVar16 = lVar8;
      if ((long)sVar20 < (long)sVar21) {
        lVar16 = lVar8 + 1;
        (_Var5._M_head_impl)->rightMisplacedRanges[lVar8]._begin = sVar20;
        (_Var5._M_head_impl)->rightMisplacedRanges[lVar8]._end = sVar21;
        local_120 = lVar16;
      }
      pp_Var13 = (_func_int **)((long)pp_Var13 + 1);
      pp_Var12 = (_func_int **)(_Var5._M_head_impl)->numTasks;
      lVar8 = lVar16;
      puVar18 = puVar19;
    } while (pp_Var13 < pp_Var12);
    if (lVar17 != 0) {
      local_f0._16_8_ = &local_118;
      local_f0._24_8_ = &local_120;
      local_b0.my_version = proxy_support;
      local_b0.my_traits = (context_traits)0x4;
      local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_b0.my_name = 8;
      local_f0._0_8_ = (small_object_pool *)&local_128;
      local_f0._8_8_ = _Var5._M_head_impl;
      tbb::detail::r1::initialize((task_group_context *)(local_f0 + 0x40));
      local_100._M_head_impl =
           (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
            *)local_f0;
      if (pp_Var12 != (_func_int **)0x0) {
        local_110.m_version_and_traits = 0;
        ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_110,0xc0);
        ptVar6->m_reserved[3] = 0;
        ptVar6->m_reserved[4] = 0;
        ptVar6->m_reserved[1] = 0;
        ptVar6->m_reserved[2] = 0;
        (ptVar6->super_task_traits).m_version_and_traits = 0;
        ptVar6->m_reserved[0] = 0;
        ptVar6->m_reserved[5] = 0;
        ptVar6->_vptr_task = (_func_int **)&PTR__task_00197118;
        ptVar6[1]._vptr_task = pp_Var12;
        ptVar6[1].super_task_traits.m_version_and_traits = 0;
        ptVar6[1].m_reserved[0] = 1;
        ptVar6[1].m_reserved[1] = (uint64_t)&local_100;
        ptVar6[1].m_reserved[2] = 0;
        ptVar6[1].m_reserved[3] = 1;
        iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
        *(undefined4 *)&ptVar6[2]._vptr_task = 0;
        *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
        ptVar6[1].m_reserved[5] = (long)iVar4 * 2 & 0x7ffffffffffffffe;
        ptVar6[2].super_task_traits.m_version_and_traits = local_110.m_version_and_traits;
        local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
        local_f0._40_4_ = 1;
        local_f0._48_8_ = 1;
        local_b8 = 1;
        ptVar6[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
        tbb::detail::r1::execute_and_wait
                  (ptVar6,(task_group_context *)(local_f0 + 0x40),(wait_context *)(local_f0 + 0x30),
                   (task_group_context *)(local_f0 + 0x40));
      }
      cVar2 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)(local_f0 + 0x40))
      ;
      if (cVar2 != '\0') {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"task cancelled");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)(local_f0 + 0x40));
    }
  }
LAB_0015c6c0:
  std::
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>_>_>
  ::~unique_ptr((unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                 *)&local_108);
  return sVar14;
}

Assistant:

__noinline size_t parallel_partitioning(T* array, 
                                            const size_t begin,
                                            const size_t end, 
                                            const Vi &identity,
                                            V &leftReduction,
                                            V &rightReduction,
                                            const IsLeft& is_left, 
                                            const Reduction_T& reduction_t,
                                            const Reduction_V& reduction_v,
                                            size_t BLOCK_SIZE = 128)
  {
    /* fall back to single threaded partitioning for small N */
    if (unlikely(end-begin < BLOCK_SIZE))
      return serial_partitioning(array,begin,end,leftReduction,rightReduction,is_left,reduction_t);

    /* otherwise use parallel code */
    else {
      typedef parallel_partition_task<T,V,Vi,IsLeft,Reduction_T,Reduction_V> partition_task;
      std::unique_ptr<partition_task> p(new partition_task(&array[begin],end-begin,identity,is_left,reduction_t,reduction_v,BLOCK_SIZE));
      return begin+p->partition(leftReduction,rightReduction);    
    }
  }